

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

bool P_MoveThing(AActor *source,DVector3 *pos,bool fog)

{
  bool bVar1;
  AActor *pAVar2;
  DVector3 local_38;
  
  local_38.X = (source->__Pos).X;
  local_38.Y = (source->__Pos).Y;
  local_38.Z = (source->__Pos).Z;
  AActor::SetOrigin(source,pos,true);
  bVar1 = P_TestMobjLocation(source);
  if (bVar1) {
    if (fog) {
      P_SpawnTeleportFog(source,pos,false,true);
      P_SpawnTeleportFog(source,&local_38,true,true);
    }
    AActor::ClearInterpolation(source);
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    if (pAVar2 == source) {
      R_ResetViewInterpolation();
    }
  }
  else {
    AActor::SetOrigin(source,&local_38,true);
  }
  return bVar1;
}

Assistant:

bool P_MoveThing(AActor *source, const DVector3 &pos, bool fog)
{
	DVector3 old = source->Pos();

	source->SetOrigin (pos, true);
	if (P_TestMobjLocation (source))
	{
		if (fog)
		{
			P_SpawnTeleportFog(source, pos, false, true);
			P_SpawnTeleportFog(source, old, true, true);
		}
		source->ClearInterpolation();
		if (source == players[consoleplayer].camera)
		{
			R_ResetViewInterpolation();
		}
		return true;
	}
	else
	{
		source->SetOrigin (old, true);
		return false;
	}
}